

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.cpp
# Opt level: O1

ProKey * __thiscall ProFile::getHashStr(ProKey *__return_storage_ptr__,ProFile *this,ushort **tPtr)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort *puVar4;
  char16_t *pcVar5;
  
  puVar4 = *tPtr;
  *tPtr = puVar4 + 1;
  uVar1 = *puVar4;
  *tPtr = puVar4 + 2;
  uVar2 = puVar4[1];
  *tPtr = puVar4 + 3;
  uVar3 = puVar4[2];
  *(undefined8 *)&(__return_storage_ptr__->super_ProString).m_file = 0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->super_ProString).m_hash = 0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->super_ProString).m_string.d.size = -0x5555555555555556;
  (__return_storage_ptr__->super_ProString).m_offset = -0x55555556;
  (__return_storage_ptr__->super_ProString).m_length = -0x55555556;
  (__return_storage_ptr__->super_ProString).m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->super_ProString).m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  pcVar5 = (this->m_proitems).d.ptr;
  if (pcVar5 == (char16_t *)0x0) {
    pcVar5 = (char16_t *)&QString::_empty;
  }
  ProKey::ProKey(__return_storage_ptr__,&this->m_proitems,
                 (int)((ulong)((long)puVar4 + (6 - (long)pcVar5)) >> 1),(uint)uVar3,
                 CONCAT22(uVar2,uVar1));
  *tPtr = (ushort *)((long)*tPtr + (ulong)((uint)uVar3 + (uint)uVar3));
  return __return_storage_ptr__;
}

Assistant:

ProKey ProFile::getHashStr(const ushort *&tPtr)
{
    uint hash = *tPtr++;
    hash |= (uint)*tPtr++ << 16;
    uint len = *tPtr++;
    ProKey ret(items(), tPtr - tokPtr(), len, hash);
    tPtr += len;
    return ret;
}